

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O0

void __thiscall LinearScan::EndDeadLifetimes(LinearScan *this,Instr *instr,bool isLoopBackEdge)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  BOOLEAN BVar4;
  uint32 uVar5;
  Type *ppLVar6;
  undefined4 *puVar7;
  Lifetime **deadStackPack;
  EditingIterator stackPackIter;
  RegNum reg;
  Lifetime **deadLifetime;
  EditingIterator iter;
  bool isLoopBackEdge_local;
  Instr *instr_local;
  LinearScan *this_local;
  
  iter.super_EditingIterator.last._7_1_ = isLoopBackEdge;
  bVar3 = SkipNumberedInstr(this,instr);
  if (!bVar3) {
    SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::GetEditingIterator
              ((EditingIterator *)&deadLifetime,this->activeLiveranges);
    while (bVar3 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::Next
                             ((EditingIterator *)&deadLifetime), bVar3) {
      ppLVar6 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                          ((Iterator *)&deadLifetime);
      uVar1 = (*ppLVar6)->end;
      uVar5 = IR::Instr::GetNumber(instr);
      if (uVar5 < uVar1) break;
      if (((iter.super_EditingIterator.last._7_1_ & 1) == 0) ||
         (BVar4 = BVSparse<Memory::JitArenaAllocator>::Test
                            ((this->curLoop->regAlloc).liveOnBackEdgeSyms,
                             ((*ppLVar6)->sym->super_Sym).m_id), BVar4 == '\0')) {
        SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Clear(&(*ppLVar6)->defList);
        SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Clear(&(*ppLVar6)->useList);
        stackPackIter.super_EditingIterator.last._7_1_ = (*ppLVar6)->reg;
        BVUnitT<unsigned_long>::Clear
                  (&this->activeRegs,(uint)stackPackIter.super_EditingIterator.last._7_1_);
        this->regContent[stackPackIter.super_EditingIterator.last._7_1_] = (Lifetime *)0x0;
        BVUnitT<unsigned_long>::Clear
                  (&this->secondChanceRegs,(uint)stackPackIter.super_EditingIterator.last._7_1_);
        if (RegTypes[stackPackIter.super_EditingIterator.last._7_1_] == TyInt64) {
          this->intRegUsedCount = this->intRegUsedCount - 1;
        }
        else {
          if (RegTypes[stackPackIter.super_EditingIterator.last._7_1_] != TyFloat64) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                               ,0x958,"(RegTypes[reg] == TyFloat64)","RegTypes[reg] == TyFloat64");
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 0;
          }
          this->floatRegUsedCount = this->floatRegUsedCount - 1;
        }
        SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::RemoveCurrent
                  ((EditingIterator *)&deadLifetime);
      }
    }
    SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::GetEditingIterator
              ((EditingIterator *)&deadStackPack,this->stackPackInUseLiveRanges);
    while (bVar3 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::Next
                             ((EditingIterator *)&deadStackPack), bVar3) {
      ppLVar6 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                          ((Iterator *)&deadStackPack);
      uVar1 = (*ppLVar6)->end;
      uVar5 = IR::Instr::GetNumber(instr);
      if (uVar5 < uVar1) {
        return;
      }
      if (((iter.super_EditingIterator.last._7_1_ & 1) == 0) ||
         (BVar4 = BVSparse<Memory::JitArenaAllocator>::Test
                            ((this->curLoop->regAlloc).liveOnBackEdgeSyms,
                             ((*ppLVar6)->sym->super_Sym).m_id), BVar4 == '\0')) {
        SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Clear(&(*ppLVar6)->defList);
        SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Clear(&(*ppLVar6)->useList);
        if ((*(ushort *)&(*ppLVar6)->field_0x9c >> 0xc & 1) == 0) {
          if ((*ppLVar6)->spillStackSlot == (StackSlot *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                               ,0x971,"(deadStackPack->spillStackSlot)",
                               "deadStackPack->spillStackSlot");
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar7 = 0;
          }
          (*ppLVar6)->spillStackSlot->lastUse = (*ppLVar6)->end;
          SList<StackSlot_*,_Memory::ArenaAllocator,_RealCount>::Push
                    (this->stackSlotsFreeList,&(*ppLVar6)->spillStackSlot);
        }
        SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::RemoveCurrent
                  ((EditingIterator *)&deadStackPack);
      }
    }
  }
  return;
}

Assistant:

void
LinearScan::EndDeadLifetimes(IR::Instr *instr, bool isLoopBackEdge)
{
    if (this->SkipNumberedInstr(instr))
    {
        return;
    }

    // Retire all active lifetime ending at this instruction
    FOREACH_SLIST_ENTRY_EDITING(Lifetime *, deadLifetime, this->activeLiveranges, iter)
    {
        if (deadLifetime->end > instr->GetNumber())
        {
            break;
        }

        if (isLoopBackEdge && this->curLoop->regAlloc.liveOnBackEdgeSyms->Test(deadLifetime->sym->m_id))
        {
            continue;
        }
        deadLifetime->defList.Clear();
        deadLifetime->useList.Clear();

        RegNum reg = deadLifetime->reg;
        this->activeRegs.Clear(reg);
        this->regContent[reg] = nullptr;
        this->secondChanceRegs.Clear(reg);
        if (RegTypes[reg] == TyMachReg)
        {
            this->intRegUsedCount--;
        }
        else
        {
            Assert(RegTypes[reg] == TyFloat64);
            this->floatRegUsedCount--;
        }
        iter.RemoveCurrent();

    } NEXT_SLIST_ENTRY_EDITING;

    // Look for spilled lifetimes which end here such that we can make their stack slot
    // available for stack-packing.
    FOREACH_SLIST_ENTRY_EDITING(Lifetime *, deadStackPack, this->stackPackInUseLiveRanges, stackPackIter)
    {
        if (deadStackPack->end > instr->GetNumber())
        {
            break;
        }

        if (isLoopBackEdge && this->curLoop->regAlloc.liveOnBackEdgeSyms->Test(deadStackPack->sym->m_id))
        {
            continue;
        }
        deadStackPack->defList.Clear();
        deadStackPack->useList.Clear();

        if (!deadStackPack->cantStackPack)
        {
            Assert(deadStackPack->spillStackSlot);
            deadStackPack->spillStackSlot->lastUse = deadStackPack->end;
            this->stackSlotsFreeList->Push(deadStackPack->spillStackSlot);
        }
        stackPackIter.RemoveCurrent();
    } NEXT_SLIST_ENTRY_EDITING;

}